

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void __thiscall btLCP::transfer_i_to_C(btLCP *this,int i)

{
  int iVar1;
  long lVar2;
  int in_ESI;
  bool *in_RDI;
  btScalar bVar3;
  int nC;
  int nC_1;
  int j;
  btScalar *ell;
  btScalar *Ltgt;
  int nC_2;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int local_44;
  int in_stack_ffffffffffffffc0;
  long lVar4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  bool *pbVar5;
  
  pbVar5 = in_RDI;
  if (*(int *)(in_RDI + 0xc) < 1) {
    **(float **)(in_RDI + 0x50) =
         1.0 / *(float *)(*(long *)(*(long *)(in_RDI + 0x18) + (long)in_ESI * 8) + (long)in_ESI * 4)
    ;
  }
  else {
    in_stack_ffffffffffffffd0 = *(int *)(in_RDI + 0xc);
    lVar2 = *(long *)(in_RDI + 0x48) + (long)(in_stack_ffffffffffffffd0 * *(int *)(in_RDI + 4)) * 4;
    lVar4 = *(long *)(in_RDI + 0x60);
    for (local_44 = 0; local_44 < in_stack_ffffffffffffffd0; local_44 = local_44 + 1) {
      *(undefined4 *)(lVar2 + (long)local_44 * 4) = *(undefined4 *)(lVar4 + (long)local_44 * 4);
    }
    in_stack_ffffffffffffffb8 = *(int *)(in_RDI + 0xc);
    in_stack_ffffffffffffffa4 =
         *(float *)(*(long *)(*(long *)(in_RDI + 0x18) + (long)in_ESI * 8) + (long)in_ESI * 4);
    bVar3 = btLargeDot(*(btScalar **)(in_RDI + 0x60),*(btScalar **)(in_RDI + 0x58),
                       in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc8 = (int)lVar2;
    in_stack_ffffffffffffffc0 = (int)lVar4;
    *(float *)(*(long *)(in_RDI + 0x50) + (long)in_stack_ffffffffffffffb8 * 4) =
         1.0 / (in_stack_ffffffffffffffa4 - bVar3);
  }
  btSwapProblem((btScalar **)CONCAT44(in_stack_ffffffffffffff94,1),
                (btScalar *)CONCAT44(in_stack_ffffffffffffff8c,*(undefined4 *)(in_RDI + 4)),
                (btScalar *)CONCAT44(in_stack_ffffffffffffff84,in_ESI),
                (btScalar *)CONCAT44(in_stack_ffffffffffffff7c,*(undefined4 *)(in_RDI + 0xc)),
                (btScalar *)CONCAT44(in_stack_ffffffffffffff74,*(undefined4 *)in_RDI),
                *(btScalar **)(in_RDI + 0x78),
                (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI,
                (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,
                in_stack_ffffffffffffffd0,(int)pbVar5);
  iVar1 = *(int *)(in_RDI + 0xc);
  *(int *)(*(long *)(in_RDI + 0x88) + (long)iVar1 * 4) = iVar1;
  *(int *)(in_RDI + 0xc) = iVar1 + 1;
  return;
}

Assistant:

void btLCP::transfer_i_to_C (int i)
{
  {
    if (m_nC > 0) {
      // ell,Dell were computed by solve1(). note, ell = D \ L1solve (L,A(i,C))
      {
        const int nC = m_nC;
        btScalar *const Ltgt = m_L + nC*m_nskip, *ell = m_ell;
        for (int j=0; j<nC; ++j) Ltgt[j] = ell[j];
      }
      const int nC = m_nC;
      m_d[nC] = btRecip (BTAROW(i)[i] - btLargeDot(m_ell,m_Dell,nC));
    }
    else {
      m_d[0] = btRecip (BTAROW(i)[i]);
    }

    btSwapProblem (m_A,m_x,m_b,m_w,m_lo,m_hi,m_p,m_state,m_findex,m_n,m_nC,i,m_nskip,1);

    const int nC = m_nC;
    m_C[nC] = nC;
    m_nC = nC + 1; // nC value is outdated after this line
  }

}